

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O3

void applyPbndCond(double **P,lattice *grid,char **FLAG)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  bVar1 = grid->edges;
  if (((bVar1 & 4) != 0) && (uVar2 = grid->delj, 0 < (int)uVar2)) {
    pdVar4 = *P;
    pdVar5 = P[1];
    lVar7 = 1;
    do {
      pdVar4[lVar7] = pdVar5[lVar7];
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar2 + 1 != lVar7);
  }
  if (((bVar1 & 8) != 0) && (uVar2 = grid->delj, 0 < (int)uVar2)) {
    pdVar4 = P[grid->deli];
    pdVar5 = P[(long)grid->deli + 1];
    lVar7 = 1;
    do {
      pdVar5[lVar7] = pdVar4[lVar7];
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar2 + 1 != lVar7);
  }
  if (((bVar1 & 2) != 0) && (uVar2 = grid->deli, 0 < (int)uVar2)) {
    lVar7 = 1;
    do {
      *P[lVar7] = P[lVar7][1];
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar2 + 1 != lVar7);
  }
  uVar2 = grid->deli;
  if ((bVar1 & 1) != 0) {
    if ((int)uVar2 < 1) {
      return;
    }
    iVar3 = grid->delj;
    lVar7 = 1;
    do {
      P[lVar7][(long)iVar3 + 1] = P[lVar7][iVar3];
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar2 + 1 != lVar7);
  }
  if (0 < (int)uVar2) {
    dVar10 = grid->delx * grid->delx;
    dVar11 = grid->dely * grid->dely;
    iVar3 = grid->delj;
    lVar7 = 1;
    do {
      if (0 < iVar3) {
        pcVar6 = FLAG[lVar7];
        uVar8 = 1;
        do {
          bVar1 = pcVar6[uVar8];
          uVar9 = bVar1 & 0xf;
          if (uVar9 != 0xf) {
            dVar14 = 0.0;
            dVar12 = 1.0;
            if ((byte)uVar9 != 0) {
              dVar12 = 0.0;
            }
            dVar13 = 1.0;
            if ((bVar1 & 10) == 0) {
              dVar13 = 0.0;
            }
            dVar15 = 1.0;
            if ((bVar1 & 5) == 0) {
              dVar15 = 0.0;
            }
            else {
              dVar14 = P[lVar7][(int)((bVar1 & 1) + (int)uVar8 + ((int)(uVar9 << 0x1d) >> 0x1f))] *
                       dVar10 + 0.0;
            }
            if ((bVar1 & 10) != 0) {
              dVar14 = dVar14 + P[(int)((((byte)uVar9 < 8) - 1) + (int)lVar7 + (uVar9 >> 1 & 1))]
                                [uVar8] * dVar11;
            }
            P[lVar7][uVar8] = dVar14 / (dVar13 * dVar11 + dVar15 * dVar10 + dVar12);
          }
          uVar8 = uVar8 + 1;
        } while (iVar3 + 1 != uVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != (ulong)uVar2 + 1);
  }
  return;
}

Assistant:

void applyPbndCond (REAL **P, lattice *grid, char **FLAG)
{
	/* Apply boundary conditions for the pressure field */
	char flag = 0;
	/* First set values on the actual boundary of the region */
	if (grid->edges & LEFT)
		for (int j = 1; j <= grid->delj; j++)
			P[0][j] = P[1][j];
	if (grid->edges & RIGHT)
		for (int j = 1; j <= grid->delj; j++)
			P[grid->deli+1][j] = P[grid->deli][j];
	if (grid->edges & BOTTOM)
		for (int i = 1; i <= grid->deli; i++)
			P[i][0] = P[i][1];
	if (grid->edges & TOP)
		for (int i = 1; i <= grid->deli; i++)
			P[i][grid->delj+1] = P[i][grid->delj];
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	REAL num, denom;
	int delNS, delOW;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			flag = LO_NIBBLE(FLAG[i][j]);
			if (flag == C_F)
				continue;
			num = 0;
			denom = (flag == C_B) + ((flag & B_NS) != 0)*dxSqrd + ((flag & B_OW) != 0)*dySqrd;
			delNS = ((flag & B_N) != 0) - ((flag & B_S) != 0);
			delOW = ((flag & B_O) != 0) - ((flag & B_W) != 0);

			if (flag & B_NS)
				num += P[i][j+delNS] * dxSqrd;
			if (flag & B_OW)
				num += P[i+delOW][j] * dySqrd;

			P[i][j] = num / denom;
		}
	return;
}